

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_level_changer::se_level_changer(se_level_changer *this)

{
  cse_alife_level_changer::cse_alife_level_changer(&this->super_cse_alife_level_changer);
  (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__se_level_changer_0024c828;
  (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.super_cse_shape.
  _vptr_cse_shape = (_func_int **)&PTR__se_level_changer_0024c890;
  (this->super_cse_alife_level_changer).field_0x199 = 1;
  (this->m_hint)._M_dataplus._M_p = (pointer)&(this->m_hint).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_hint,"level_changer_invitation","");
  return;
}

Assistant:

se_level_changer::se_level_changer():
	m_enabled(true), m_hint("level_changer_invitation") {}